

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

char * lys_datatype2str(LY_DATA_TYPE basetype)

{
  char *pcStack_10;
  LY_DATA_TYPE basetype_local;
  
  switch(basetype) {
  case LY_TYPE_BINARY:
    pcStack_10 = "binary";
    break;
  case LY_TYPE_UINT8:
    pcStack_10 = "uint8";
    break;
  case LY_TYPE_UINT16:
    pcStack_10 = "uint16";
    break;
  case LY_TYPE_UINT32:
    pcStack_10 = "uint32";
    break;
  case LY_TYPE_UINT64:
    pcStack_10 = "uint64";
    break;
  case LY_TYPE_STRING:
    pcStack_10 = "string";
    break;
  case LY_TYPE_BITS:
    pcStack_10 = "bits";
    break;
  case LY_TYPE_BOOL:
    pcStack_10 = "boolean";
    break;
  case LY_TYPE_DEC64:
    pcStack_10 = "decimal64";
    break;
  case LY_TYPE_EMPTY:
    pcStack_10 = "empty";
    break;
  case LY_TYPE_ENUM:
    pcStack_10 = "enumeration";
    break;
  case LY_TYPE_IDENT:
    pcStack_10 = "identityref";
    break;
  case LY_TYPE_INST:
    pcStack_10 = "instance-identifier";
    break;
  case LY_TYPE_LEAFREF:
    pcStack_10 = "leafref";
    break;
  case LY_TYPE_UNION:
    pcStack_10 = "union";
    break;
  case LY_TYPE_INT8:
    pcStack_10 = "int8";
    break;
  case LY_TYPE_INT16:
    pcStack_10 = "int16";
    break;
  case LY_TYPE_INT32:
    pcStack_10 = "int32";
    break;
  case LY_TYPE_INT64:
    pcStack_10 = "int64";
    break;
  default:
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

const char *
lys_datatype2str(LY_DATA_TYPE basetype)
{
    switch (basetype) {
    case LY_TYPE_BINARY:
        return "binary";
    case LY_TYPE_UINT8:
        return "uint8";
    case LY_TYPE_UINT16:
        return "uint16";
    case LY_TYPE_UINT32:
        return "uint32";
    case LY_TYPE_UINT64:
        return "uint64";
    case LY_TYPE_STRING:
        return "string";
    case LY_TYPE_BITS:
        return "bits";
    case LY_TYPE_BOOL:
        return "boolean";
    case LY_TYPE_DEC64:
        return "decimal64";
    case LY_TYPE_EMPTY:
        return "empty";
    case LY_TYPE_ENUM:
        return "enumeration";
    case LY_TYPE_IDENT:
        return "identityref";
    case LY_TYPE_INST:
        return "instance-identifier";
    case LY_TYPE_LEAFREF:
        return "leafref";
    case LY_TYPE_UNION:
        return "union";
    case LY_TYPE_INT8:
        return "int8";
    case LY_TYPE_INT16:
        return "int16";
    case LY_TYPE_INT32:
        return "int32";
    case LY_TYPE_INT64:
        return "int64";
    default:
        return "unknown";
    }
}